

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte_encode.c
# Opt level: O2

size_t streamvbyte_encode(uint32_t *in,uint32_t count,uint8_t *out)

{
  uint uVar1;
  uint8_t *dataPtr;
  uint *puVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  byte bVar8;
  
  dataPtr._0_4_ = count + 3;
  puVar2 = (uint *)(out + ((uint)dataPtr >> 2));
  if (count != 0) {
    bVar3 = 0;
    bVar8 = 0;
    pbVar7 = out;
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      if (bVar3 == 8) {
        *pbVar7 = bVar8;
        pbVar7 = pbVar7 + 1;
        bVar3 = 0;
        bVar8 = 0;
      }
      uVar1 = in[uVar5];
      if (uVar1 < 0x100) {
        *(char *)puVar2 = (char)uVar1;
        iVar4 = 0;
        lVar6 = 1;
      }
      else if (uVar1 < 0x10000) {
        *(short *)puVar2 = (short)uVar1;
        lVar6 = 2;
        iVar4 = 1;
      }
      else if (uVar1 < 0x1000000) {
        *(short *)puVar2 = (short)uVar1;
        *(char *)((long)puVar2 + 2) = (char)(uVar1 >> 0x10);
        lVar6 = 3;
        iVar4 = 2;
      }
      else {
        *puVar2 = uVar1;
        lVar6 = 4;
        iVar4 = 3;
      }
      puVar2 = (uint *)((long)puVar2 + lVar6);
      bVar8 = bVar8 | (byte)(iVar4 << (bVar3 & 0x1f));
      bVar3 = bVar3 + 2;
    }
    *pbVar7 = bVar8;
  }
  return (long)puVar2 - (long)out;
}

Assistant:

size_t streamvbyte_encode(const uint32_t *in, uint32_t count, uint8_t *out) {
#ifdef __AVX__
return streamvbyte_encode_SSSE3(in,count,out);
#else
  uint8_t *keyPtr = out;
  uint32_t keyLen = (count + 3) / 4;  // 2-bits rounded to full byte
  uint8_t *dataPtr = keyPtr + keyLen; // variable byte data after all keys

#if defined(__ARM_NEON__)

  uint32_t count_quads = count / 4;
  count -= 4 * count_quads;

  for (uint32_t c = 0; c < count_quads; c++) {
    dataPtr += streamvbyte_encode_quad(in, dataPtr, keyPtr);
    keyPtr++;
    in += 4;
  }

#endif

  return svb_encode_scalar(in, keyPtr, dataPtr, count) - out;
#endif// no AVX
}